

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void bsp_begin(bsp_pid_t maxprocs)

{
  FILE *__stream;
  size_t beta_00;
  double alpha_00;
  size_t max_msg_size_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  Spmd *pSVar4;
  int *piVar5;
  undefined8 uVar6;
  Rdma *this;
  MPI_Comm poVar7;
  size_t small_exch_size_00;
  Bsmp *this_00;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string method;
  size_t min_n_hp_msg_size;
  double beta;
  double alpha;
  int local_38;
  uint local_34;
  int small_exch_size;
  int max_small_exchange_size;
  size_t max_msg_size;
  int local_14;
  int local_10;
  int mpi_pid;
  int mpi_init;
  bsp_pid_t maxprocs_local;
  
  local_10 = 0;
  mpi_pid = maxprocs;
  MPI_Initialized(&local_10);
  if (local_10 == 0) {
    MPI_Init(0);
    atexit(bsp_check_exit);
  }
  local_14 = 0;
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_14);
  if (s_spmd != (Spmd *)0x0) {
    bsp_abort("bsp_begin: May be called only once\n");
  }
  if ((local_14 == 0) && (mpi_pid < 1)) {
    bsp_abort("bsp_begin: The requested number of processes must be strictly greater than 0. Instead, it was %d\n"
              ,(ulong)(uint)mpi_pid);
  }
  pSVar4 = (Spmd *)operator_new(0x28);
  iVar3 = mpi_pid;
  bsplib::Spmd::Spmd(pSVar4,mpi_pid);
  s_spmd = pSVar4;
  bVar1 = bsplib::Spmd::active(pSVar4);
  if (bVar1) {
    _small_exch_size = 0x7fffffff;
    bVar1 = bsplib::read_env<unsigned_long>
                      ("BSPONMPI_MAX_MSG_SIZE",(unsigned_long *)&small_exch_size);
    if ((bVar1) || (_small_exch_size == 0)) {
      fprintf(_stderr,
              "bsp_begin: WARNING! BSPONMPI_MAX_MSG_SIZE was not set to a positive, non-zero integer\n"
             );
    }
    iVar3 = std::numeric_limits<int>::max();
    iVar2 = bsplib::Spmd::nprocs(s_spmd);
    local_34 = iVar3 / iVar2;
    alpha._4_4_ = 0x400;
    piVar5 = std::min<int>((int *)((long)&alpha + 4),(int *)&local_34);
    local_38 = *piVar5;
    bVar1 = bsplib::read_env<int>("BSPONMPI_SMALL_EXCHANGE_SIZE",&local_38);
    if (((bVar1) || (local_38 < 0)) || ((int)local_34 < local_38)) {
      fprintf(_stderr,
              "bsp_begin: WARNING! BSPONMPI_SMALL_EXCHANGE_SIZE was not an integer between 0 and %d \n"
              ,(ulong)local_34);
    }
    beta = 10000.0;
    min_n_hp_msg_size = 0x3ff0000000000000;
    bVar1 = bsplib::read_env<double>("BSPONMPI_P2P_LATENCY",&beta);
    if ((bVar1) || (beta < 0.0)) {
      beta = 10000.0;
      fprintf(_stderr,
              "bsp_begin: BSPONMPI_P2P_LATENCY was not a positive number. Using default: %g\n",
              0x40c3880000000000);
    }
    bVar1 = bsplib::read_env<double>("BSPONMPI_P2P_MSGGAP",(double *)&min_n_hp_msg_size);
    if ((bVar1) || ((double)min_n_hp_msg_size < 0.0)) {
      min_n_hp_msg_size = 0x3ff0000000000000;
      fprintf(_stderr,
              "bsp_begin: BSPONMPI_P2P_MSGGAP was not a positive number. Using default: %g\n",
              0x3ff0000000000000);
    }
    method.field_2._8_8_ = 0;
    bVar1 = bsplib::read_env<unsigned_long>
                      ("BSPONMPI_P2P_N_HP",(unsigned_long *)(method.field_2._M_local_buf + 8));
    if (bVar1) {
      method.field_2._8_8_ = 0;
      fprintf(_stderr,
              "bsp_begin: BSPONMPI_P2P_N_HP was not a non-negative integer. Using default %ld\n",0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"rma",&local_79);
    std::allocator<char>::~allocator(&local_79);
    bVar1 = bsplib::read_env<std::__cxx11::string>
                      ("BSPONMPI_A2A_METHOD",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
    if ((bVar1) ||
       ((bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78,"rma"), bVar1 &&
        (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78,"msg"), bVar1)))) {
      std::__cxx11::string::operator=((string *)local_78,"rma");
      __stream = _stderr;
      uVar6 = std::__cxx11::string::c_str();
      fprintf(__stream,
              "bsp_begin: BSPONMPI_A2A_METHOD was set to neither \'msg\' nor \'rma\'. Using default \'%s\'\n"
              ,uVar6);
    }
    this = (Rdma *)operator_new(0x500);
    poVar7 = bsplib::Spmd::comm(s_spmd);
    max_msg_size_00 = _small_exch_size;
    alpha_00 = beta;
    beta_00 = min_n_hp_msg_size;
    uVar6 = method.field_2._8_8_;
    small_exch_size_00 = (size_t)local_38;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,"rma");
    bsplib::Rdma::Rdma(this,poVar7,max_msg_size_00,small_exch_size_00,alpha_00,(double)beta_00,uVar6
                       ,(byte)~bVar1 & MSG);
    s_rdma = this;
    this_00 = (Bsmp *)operator_new(0x218);
    poVar7 = bsplib::Spmd::comm(s_spmd);
    bsplib::Bsmp::Bsmp(this_00,poVar7,_small_exch_size,(long)local_38);
    s_bsmp = this_00;
    std::__cxx11::string::~string((string *)local_78);
    return;
  }
  iVar2 = bsplib::Spmd::end_sync(s_spmd);
  if (iVar2 != 0) {
    bsp_abort("bsp_end: Unexpected internal error\n");
  }
  bsplib::Spmd::close(s_spmd,iVar3);
  pSVar4 = s_spmd;
  if (s_spmd != (Spmd *)0x0) {
    bsplib::Spmd::~Spmd(s_spmd);
    operator_delete(pSVar4,0x28);
  }
  s_spmd = (Spmd *)0x0;
  exit(0);
}

Assistant:

void bsp_begin( bsp_pid_t maxprocs )
{
    int mpi_init = 0;
    MPI_Initialized(&mpi_init);
    if (!mpi_init) {
        MPI_Init(NULL, NULL);
        atexit( bsp_check_exit );
    }

    int mpi_pid = 0;
    MPI_Comm_rank( MPI_COMM_WORLD, &mpi_pid );

    if (s_spmd)
        bsp_abort( "bsp_begin: May be called only once\n" );
 
    if (mpi_pid == 0 && maxprocs <= 0)
        bsp_abort("bsp_begin: The requested number of processes must be "
                "strictly greater than 0. Instead, it was %d\n", maxprocs );

    s_spmd = new bsplib::Spmd( maxprocs );
    if ( ! s_spmd->active() ) {
        if (s_spmd->end_sync())
            bsp_abort( "bsp_end: Unexpected internal error\n");
        s_spmd->close();
        delete s_spmd;
        s_spmd = NULL;
        std::exit(EXIT_SUCCESS);
    }

    size_t max_msg_size = INT_MAX; 
    if ( bsplib::read_env( "BSPONMPI_MAX_MSG_SIZE", max_msg_size ) 
        || max_msg_size == 0 ) {
        fprintf(stderr, "bsp_begin: WARNING! BSPONMPI_MAX_MSG_SIZE "
                "was not set to a positive, non-zero integer\n");
    }

    int max_small_exchange_size = 
        std::numeric_limits<int>::max() / s_spmd->nprocs() ;
    int small_exch_size = std::min( 1024, max_small_exchange_size ) ;
    if (bsplib::read_env( "BSPONMPI_SMALL_EXCHANGE_SIZE", small_exch_size ) 
        || small_exch_size < 0 
        || small_exch_size > max_small_exchange_size ) {
        fprintf(stderr, "bsp_begin: WARNING! BSPONMPI_SMALL_EXCHANGE_SIZE"
                        " was not an integer between 0 and %d \n",
                        max_small_exchange_size );
    }

    double alpha = 1e+4, beta = 1.0;
    if (bsplib::read_env( "BSPONMPI_P2P_LATENCY", alpha ) || alpha < 0.0) {
        alpha = 1e+4;
        fprintf(stderr, "bsp_begin: BSPONMPI_P2P_LATENCY was not a positive number. Using default: %g\n", alpha);
    }
    if (bsplib::read_env( "BSPONMPI_P2P_MSGGAP", beta ) || beta < 0.0) {
        beta = 1.0;
        fprintf(stderr, "bsp_begin: BSPONMPI_P2P_MSGGAP was not a positive number. Using default: %g\n", beta);
    }
    size_t min_n_hp_msg_size = 0;
    if (bsplib::read_env( "BSPONMPI_P2P_N_HP", min_n_hp_msg_size ) ) {
        min_n_hp_msg_size = 0;
        fprintf(stderr, "bsp_begin: BSPONMPI_P2P_N_HP was not a non-negative integer. Using default %ld\n", (long) min_n_hp_msg_size );
    }

    
    std::string method = "rma";
    if (bsplib::read_env( "BSPONMPI_A2A_METHOD", method ) 
            || ( method != "rma" && method != "msg" ) ) {
        method = "rma";
        fprintf(stderr, "bsp_begin: BSPONMPI_A2A_METHOD was set to "
                "neither 'msg' nor 'rma'. Using default '%s'\n",
                method.c_str() );
    }

    s_rdma = new bsplib::Rdma( s_spmd->comm(), max_msg_size, 
                               small_exch_size, alpha, beta, 
                               min_n_hp_msg_size,
                               method == "rma" ? bsplib::A2A::RMA 
                                               : bsplib::A2A::MSG );
    s_bsmp = new bsplib::Bsmp( s_spmd->comm(), max_msg_size,
                               small_exch_size);
}